

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O0

void __thiscall license::test::compare_wrong_data::test_method(compare_wrong_data *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  reference pvVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]> local_90;
  assertion_result local_70;
  basic_cstring<const_char> local_58;
  basic_cstring<const_char> local_48 [2];
  undefined1 local_28 [8];
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> data;
  compare_wrong_data *this_local;
  
  builtin_memcpy(pc_id.m_data._M_elems,"BBBBBBB",7);
  hw_identifier::HwIdentifier::HwIdentifier((HwIdentifier *)local_28);
  hw_identifier::HwIdentifier::set_data
            ((HwIdentifier *)local_28,(array<unsigned_char,_7UL> *)&pc_id.m_data);
  pvVar3 = std::array<unsigned_char,_7UL>::operator[]((array<unsigned_char,_7UL> *)&pc_id.m_data,4);
  *pvVar3 = '\0';
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x8a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_58);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_48,0x2d,&local_58);
    bVar2 = hw_identifier::HwIdentifier::data_match
                      ((HwIdentifier *)local_28,(array<unsigned_char,_7UL> *)&pc_id.m_data);
    boost::test_tools::assertion_result::assertion_result(&local_70,(bool)(~bVar2 & 1));
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_90,prev,(char (*) [21])"Data shouldn\'t match");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x8a);
    boost::test_tools::tt_detail::report_assertion(&local_70,&local_90,&local_a0,0x2d,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
    ~lazy_ostream_impl(&local_90);
    boost::test_tools::assertion_result::~assertion_result(&local_70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  hw_identifier::HwIdentifier::~HwIdentifier((HwIdentifier *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compare_wrong_data) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0x42, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	data[4] = 0;
	BOOST_CHECK_MESSAGE(!pc_id.data_match(data), "Data shouldn't match");
}